

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O3

int __thiscall ncnn::Reshape::forward(Reshape *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  size_t sVar6;
  byte bVar7;
  Mat *pMVar8;
  byte bVar9;
  byte bVar10;
  uint _w;
  uint _h;
  uint _c;
  uint _d;
  byte bVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  size_t sVar15;
  undefined4 *puVar16;
  int iVar17;
  ulong uVar18;
  undefined4 *puVar19;
  ulong uVar20;
  undefined4 *puVar21;
  ulong uVar22;
  undefined4 *puVar23;
  ulong uVar24;
  Allocator *pAVar25;
  size_t sVar26;
  int iVar27;
  undefined4 *puVar28;
  int *local_118;
  Mat local_f0;
  void *local_a8;
  Mat *local_a0;
  Mat local_98;
  Allocator *local_50;
  size_t local_48;
  size_t local_40;
  void *local_38;
  
  local_a8 = (void *)bottom_blob->elemsize;
  uVar1 = bottom_blob->w;
  uVar2 = bottom_blob->h;
  uVar3 = bottom_blob->d;
  uVar4 = bottom_blob->c;
  uVar12 = uVar3 * uVar4 * uVar2 * uVar1;
  iVar13 = bottom_blob->dims;
  _w = this->w;
  _h = this->h;
  _d = this->d;
  _c = this->c;
  iVar17 = this->ndim;
  if (iVar17 == 1) {
    if (_w == 0) {
      _w = uVar1;
    }
    if (_w == 0xffffffff) {
      _w = uVar12;
    }
    bVar10 = 0;
    if (iVar13 == 1) {
      bVar11 = 0;
      bVar7 = 0;
      if (uVar1 == _w) {
LAB_0032a6a9:
        if (top_blob != bottom_blob) {
          piVar5 = bottom_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar5 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar5;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar13 = bottom_blob->w;
          iVar17 = bottom_blob->h;
          iVar27 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar13;
          top_blob->h = iVar17;
          top_blob->d = iVar27;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
          return 0;
        }
        return 0;
      }
    }
    else {
LAB_0032a8c3:
      bVar7 = 0;
      bVar9 = 0;
LAB_0032a8c5:
      bVar11 = bVar9;
      bVar10 = bVar7;
      bVar7 = 0;
    }
  }
  else {
    if (iVar17 == 4) {
      if (_w == 0) {
        _w = uVar1;
      }
      if (_h == 0) {
        _h = uVar2;
      }
      if (_c == 0) {
        _c = uVar4;
      }
      if (_d == 0) {
        _d = uVar3;
      }
      if (_w == 0xffffffff) {
        uVar18 = (long)((ulong)(uint)((int)((long)(int)uVar12 / (long)(int)_c) >> 0x1f) << 0x20 |
                       (long)(int)uVar12 / (long)(int)_c & 0xffffffffU) / (long)(int)_d;
        _w = (uint)((long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) /
                   (long)(int)_h);
      }
      if (_h == 0xffffffff) {
        uVar18 = (long)((ulong)(uint)((int)((long)(int)uVar12 / (long)(int)_c) >> 0x1f) << 0x20 |
                       (long)(int)uVar12 / (long)(int)_c & 0xffffffffU) / (long)(int)_d;
        _h = (uint)((long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) /
                   (long)(int)_w);
      }
      if (_d == 0xffffffff) {
        uVar18 = (long)((ulong)(uint)((int)((long)(int)uVar12 / (long)(int)_c) >> 0x1f) << 0x20 |
                       (long)(int)uVar12 / (long)(int)_c & 0xffffffffU) / (long)(int)_h;
        _d = (uint)((long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) /
                   (long)(int)_w);
      }
      if (_c == 0xffffffff) {
        uVar18 = (long)((ulong)(uint)((int)((long)(int)uVar12 / (long)(int)_d) >> 0x1f) << 0x20 |
                       (long)(int)uVar12 / (long)(int)_d & 0xffffffffU) / (long)(int)_h;
        _c = (uint)((long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) /
                   (long)(int)_w);
      }
      bVar7 = 1;
      bVar9 = 0;
      if ((iVar13 == 4) && (uVar4 == _c)) {
        if (top_blob != bottom_blob) {
          piVar5 = bottom_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar5 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar5;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar13 = bottom_blob->w;
          iVar17 = bottom_blob->h;
          iVar27 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar13;
          top_blob->h = iVar17;
          top_blob->d = iVar27;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
        top_blob->w = _w;
        top_blob->h = _h;
        top_blob->d = _d;
        return 0;
      }
      goto LAB_0032a8c5;
    }
    if (iVar17 == 3) {
      if (_w == 0) {
        _w = uVar1;
      }
      if (_h == 0) {
        _h = uVar2;
      }
      if (_c == 0) {
        _c = uVar4;
      }
      if (_w == 0xffffffff) {
        _w = (uint)((long)((ulong)(uint)((int)((long)(int)uVar12 / (long)(int)_c) >> 0x1f) << 0x20 |
                          (long)(int)uVar12 / (long)(int)_c & 0xffffffffU) / (long)(int)_h);
      }
      if (_h == 0xffffffff) {
        _h = (uint)((long)((ulong)(uint)((int)((long)(int)uVar12 / (long)(int)_c) >> 0x1f) << 0x20 |
                          (long)(int)uVar12 / (long)(int)_c & 0xffffffffU) / (long)(int)_w);
      }
      if (_c == 0xffffffff) {
        _c = (uint)((long)((ulong)(uint)((int)((long)(int)uVar12 / (long)(int)_h) >> 0x1f) << 0x20 |
                          (long)(int)uVar12 / (long)(int)_h & 0xffffffffU) / (long)(int)_w);
      }
      bVar10 = 0;
      bVar7 = 1;
      if ((iVar13 == 3) && (uVar4 == _c)) {
        if (top_blob != bottom_blob) {
          piVar5 = bottom_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar5 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar5;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar13 = bottom_blob->w;
          iVar17 = bottom_blob->h;
          iVar27 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar13;
          top_blob->h = iVar17;
          top_blob->d = iVar27;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
        top_blob->w = _w;
        top_blob->h = _h;
        return 0;
      }
      bVar11 = 0;
    }
    else {
      if (iVar17 != 2) goto LAB_0032a8c3;
      if (_w == 0) {
        _w = uVar1;
      }
      if (_h == 0) {
        _h = uVar2;
      }
      if (_w == 0xffffffff) {
        _w = (int)uVar12 / (int)_h;
      }
      if (_h == 0xffffffff) {
        _h = (int)uVar12 / (int)_w;
      }
      bVar10 = 0;
      bVar11 = 1;
      bVar7 = 0;
      bVar9 = 1;
      if (iVar13 != 2) goto LAB_0032a8c5;
      bVar7 = 0;
      if (uVar2 == _h) goto LAB_0032a6a9;
    }
  }
  local_a0 = top_blob;
  if ((((bool)((iVar13 == 4 & bVar10 | iVar13 == 3 & bVar7) & uVar4 == _c)) ||
      ((bool)(iVar13 == 2 & bVar11 & uVar2 == _h))) || (this->permute != 1)) {
    if (iVar17 == 1) {
      Mat::reshape(&local_f0,bottom_blob,_w,opt->blob_allocator);
      if (&local_f0 != top_blob) {
        if (local_f0.refcount != (int *)0x0) {
          LOCK();
          *local_f0.refcount = *local_f0.refcount + 1;
          UNLOCK();
        }
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_f0.data;
        top_blob->refcount = local_f0.refcount;
        top_blob->elemsize = local_f0.elemsize;
        top_blob->elempack = local_f0.elempack;
        top_blob->allocator = local_f0.allocator;
        top_blob->dims = local_f0.dims;
        top_blob->w = local_f0.w;
        top_blob->h = local_f0.h;
        top_blob->d = local_f0.d;
        top_blob->c = local_f0.c;
        top_blob->cstep = local_f0.cstep;
      }
      if (local_f0.refcount != (int *)0x0) {
        LOCK();
        *local_f0.refcount = *local_f0.refcount + -1;
        UNLOCK();
        if (*local_f0.refcount == 0) {
          if (local_f0.allocator == (Allocator *)0x0) {
            if (local_f0.data != (void *)0x0) {
              free(local_f0.data);
            }
          }
          else {
            (*(local_f0.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar17 = this->ndim;
    }
    if (iVar17 == 2) {
      Mat::reshape(&local_f0,bottom_blob,_w,_h,opt->blob_allocator);
      if (&local_f0 != top_blob) {
        if (local_f0.refcount != (int *)0x0) {
          LOCK();
          *local_f0.refcount = *local_f0.refcount + 1;
          UNLOCK();
        }
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_f0.data;
        top_blob->refcount = local_f0.refcount;
        top_blob->elemsize = local_f0.elemsize;
        top_blob->elempack = local_f0.elempack;
        top_blob->allocator = local_f0.allocator;
        top_blob->dims = local_f0.dims;
        top_blob->w = local_f0.w;
        top_blob->h = local_f0.h;
        top_blob->d = local_f0.d;
        top_blob->c = local_f0.c;
        top_blob->cstep = local_f0.cstep;
      }
      if (local_f0.refcount != (int *)0x0) {
        LOCK();
        *local_f0.refcount = *local_f0.refcount + -1;
        UNLOCK();
        if (*local_f0.refcount == 0) {
          if (local_f0.allocator == (Allocator *)0x0) {
            if (local_f0.data != (void *)0x0) {
              free(local_f0.data);
            }
          }
          else {
            (*(local_f0.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar17 = this->ndim;
    }
    if (iVar17 == 3) {
      Mat::reshape(&local_f0,bottom_blob,_w,_h,_c,opt->blob_allocator);
      if (&local_f0 != top_blob) {
        if (local_f0.refcount != (int *)0x0) {
          LOCK();
          *local_f0.refcount = *local_f0.refcount + 1;
          UNLOCK();
        }
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_f0.data;
        top_blob->refcount = local_f0.refcount;
        top_blob->elemsize = local_f0.elemsize;
        top_blob->elempack = local_f0.elempack;
        top_blob->allocator = local_f0.allocator;
        top_blob->dims = local_f0.dims;
        top_blob->w = local_f0.w;
        top_blob->h = local_f0.h;
        top_blob->d = local_f0.d;
        top_blob->c = local_f0.c;
        top_blob->cstep = local_f0.cstep;
      }
      if (local_f0.refcount != (int *)0x0) {
        LOCK();
        *local_f0.refcount = *local_f0.refcount + -1;
        UNLOCK();
        if (*local_f0.refcount == 0) {
          if (local_f0.allocator == (Allocator *)0x0) {
            if (local_f0.data != (void *)0x0) {
              free(local_f0.data);
            }
          }
          else {
            (*(local_f0.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar17 = this->ndim;
    }
    if (iVar17 == 4) {
      Mat::reshape(&local_f0,bottom_blob,_w,_h,_d,_c,opt->blob_allocator);
      if (&local_f0 != top_blob) {
        if (local_f0.refcount != (int *)0x0) {
          LOCK();
          *local_f0.refcount = *local_f0.refcount + 1;
          UNLOCK();
        }
        piVar5 = top_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_f0.data;
        top_blob->refcount = local_f0.refcount;
        top_blob->elemsize = local_f0.elemsize;
        top_blob->elempack = local_f0.elempack;
        top_blob->allocator = local_f0.allocator;
        top_blob->dims = local_f0.dims;
        top_blob->w = local_f0.w;
        top_blob->h = local_f0.h;
        top_blob->d = local_f0.d;
        top_blob->c = local_f0.c;
        top_blob->cstep = local_f0.cstep;
      }
      if (local_f0.refcount != (int *)0x0) {
        LOCK();
        *local_f0.refcount = *local_f0.refcount + -1;
        UNLOCK();
        if (*local_f0.refcount == 0) {
          if (local_f0.allocator == (Allocator *)0x0) {
            if (local_f0.data != (void *)0x0) {
              free(local_f0.data);
            }
          }
          else {
            (*(local_f0.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      return 0;
    }
    return -100;
  }
  local_f0.data = bottom_blob->data;
  local_f0.refcount = bottom_blob->refcount;
  local_f0.elempack = bottom_blob->elempack;
  local_f0.allocator = bottom_blob->allocator;
  local_f0.cstep = bottom_blob->cstep;
  if (local_f0.refcount != (int *)0x0) {
    LOCK();
    *local_f0.refcount = *local_f0.refcount + 1;
    UNLOCK();
  }
  local_f0.elemsize = (size_t)local_a8;
  local_f0.dims = iVar13;
  local_f0.w = uVar1;
  local_f0.h = uVar2;
  local_f0.d = uVar3;
  local_f0.c = uVar4;
  if (iVar13 == 2) {
    uVar1 = bottom_blob->w;
    uVar2 = bottom_blob->h;
    Mat::create(&local_f0,uVar2,uVar1,(size_t)local_a8,opt->workspace_allocator);
    iVar17 = -100;
    if (((undefined4 *)local_f0.data == (undefined4 *)0x0) ||
       ((long)local_f0.c * local_f0.cstep == 0)) goto LAB_0032b956;
    if (0 < (int)uVar1) {
      puVar19 = (undefined4 *)bottom_blob->data;
      uVar18 = 0;
      puVar21 = (undefined4 *)local_f0.data;
      do {
        uVar20 = (ulong)uVar2;
        puVar23 = puVar19;
        if (0 < (int)uVar2) {
          do {
            *puVar21 = *puVar23;
            puVar21 = puVar21 + 1;
            puVar23 = puVar23 + uVar1;
            uVar20 = uVar20 - 1;
          } while (uVar20 != 0);
        }
        uVar18 = uVar18 + 1;
        puVar19 = puVar19 + 1;
      } while (uVar18 != uVar1);
      goto LAB_0032aa35;
    }
  }
  else {
LAB_0032aa35:
    if (iVar13 == 3) {
      uVar1 = bottom_blob->w;
      uVar2 = bottom_blob->h;
      uVar3 = bottom_blob->c;
      Mat::create(&local_f0,uVar3,uVar1,uVar2,(size_t)local_a8,opt->workspace_allocator);
      iVar17 = -100;
      if (((undefined4 *)local_f0.data == (undefined4 *)0x0) ||
         ((long)local_f0.c * local_f0.cstep == 0)) goto LAB_0032b956;
      if ((int)uVar2 < 1) goto LAB_0032ac11;
      uVar18 = 0;
      do {
        if (0 < (int)uVar1) {
          sVar26 = bottom_blob->elemsize;
          puVar21 = (undefined4 *)(sVar26 * uVar18 * (long)bottom_blob->w + (long)bottom_blob->data)
          ;
          puVar19 = (undefined4 *)
                    (local_f0.cstep * local_f0.elemsize * uVar18 + (long)local_f0.data);
          sVar15 = bottom_blob->cstep;
          uVar20 = 0;
          do {
            uVar22 = (ulong)uVar3;
            puVar23 = puVar21;
            if (0 < (int)uVar3) {
              do {
                *puVar19 = *puVar23;
                puVar19 = puVar19 + 1;
                puVar23 = (undefined4 *)((long)puVar23 + sVar26 * sVar15);
                uVar22 = uVar22 - 1;
              } while (uVar22 != 0);
            }
            uVar20 = uVar20 + 1;
            puVar21 = puVar21 + 1;
          } while (uVar20 != uVar1);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != uVar2);
    }
    if (iVar13 == 4) {
      uVar1 = bottom_blob->w;
      uVar2 = bottom_blob->h;
      uVar3 = bottom_blob->d;
      uVar4 = bottom_blob->c;
      Mat::create(&local_f0,uVar4,uVar1,uVar2,uVar3,(size_t)local_a8,opt->workspace_allocator);
      iVar17 = -100;
      if (((undefined4 *)local_f0.data == (undefined4 *)0x0) ||
         ((long)local_f0.c * local_f0.cstep == 0)) goto LAB_0032b956;
      if (0 < (int)uVar3) {
        uVar18 = 0;
        do {
          if (0 < (int)uVar2) {
            puVar19 = (undefined4 *)
                      (local_f0.cstep * local_f0.elemsize * uVar18 + (long)local_f0.data);
            uVar20 = 0;
            do {
              if (0 < (int)uVar1) {
                sVar26 = bottom_blob->elemsize;
                puVar21 = (undefined4 *)
                          ((long)bottom_blob->w * sVar26 * ((long)bottom_blob->h * uVar18 + uVar20)
                          + (long)bottom_blob->data);
                sVar15 = bottom_blob->cstep;
                uVar22 = 0;
                do {
                  puVar23 = puVar21;
                  uVar24 = (ulong)uVar4;
                  if (0 < (int)uVar4) {
                    do {
                      *puVar19 = *puVar23;
                      puVar19 = puVar19 + 1;
                      puVar23 = (undefined4 *)((long)puVar23 + sVar26 * sVar15);
                      uVar24 = uVar24 - 1;
                    } while (uVar24 != 0);
                  }
                  uVar22 = uVar22 + 1;
                  puVar21 = puVar21 + 1;
                } while (uVar22 != uVar1);
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 != uVar2);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar3);
      }
    }
  }
LAB_0032ac11:
  iVar13 = this->ndim;
  if (iVar13 == 2) {
    Mat::reshape(&local_98,&local_f0,_h,_w,opt->workspace_allocator);
    sVar15 = local_98.cstep;
    iVar27 = local_98.c;
    pAVar25 = local_98.allocator;
    sVar26 = local_98.elemsize;
    puVar19 = (undefined4 *)local_98.data;
    if (local_98.refcount == (int *)0x0) {
LAB_0032ae7c:
      local_118 = (int *)0x0;
    }
    else {
      LOCK();
      *local_98.refcount = *local_98.refcount + 1;
      UNLOCK();
      if (local_98.refcount == (int *)0x0) goto LAB_0032ae7c;
      local_118 = local_98.refcount;
      LOCK();
      *local_98.refcount = *local_98.refcount + -1;
      UNLOCK();
      if (*local_98.refcount == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_98.data != (undefined4 *)0x0) {
            free(local_98.data);
          }
        }
        else {
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar13 = this->ndim;
  }
  else {
    sVar15 = 0;
    iVar27 = 0;
    pAVar25 = (Allocator *)0x0;
    sVar26 = 0;
    local_118 = (int *)0x0;
    puVar19 = (undefined4 *)0x0;
    if (iVar13 == 1) {
      Mat::reshape(&local_98,&local_f0,_w,opt->blob_allocator);
      pMVar8 = local_a0;
      if (&local_98 != local_a0) {
        if (local_98.refcount != (int *)0x0) {
          LOCK();
          *local_98.refcount = *local_98.refcount + 1;
          UNLOCK();
        }
        piVar5 = local_a0->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_a0->allocator == (Allocator *)0x0) {
              if (local_a0->data != (void *)0x0) {
                free(local_a0->data);
              }
            }
            else {
              (*local_a0->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar8->data = local_98.data;
        pMVar8->refcount = local_98.refcount;
        pMVar8->elemsize = local_98.elemsize;
        pMVar8->elempack = local_98.elempack;
        pMVar8->allocator = local_98.allocator;
        pMVar8->dims = local_98.dims;
        pMVar8->w = local_98.w;
        pMVar8->h = local_98.h;
        pMVar8->d = local_98.d;
        pMVar8->c = local_98.c;
        pMVar8->cstep = local_98.cstep;
      }
      if (local_98.refcount != (int *)0x0) {
        LOCK();
        *local_98.refcount = *local_98.refcount + -1;
        UNLOCK();
        if (*local_98.refcount == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if ((undefined4 *)local_98.data != (undefined4 *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (*(local_98.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if ((pMVar8->data == (void *)0x0) || (iVar17 = 0, (long)local_a0->c * local_a0->cstep == 0)) {
        iVar17 = -100;
      }
      goto LAB_0032b956;
    }
  }
  if (iVar13 == 3) {
    Mat::reshape(&local_98,&local_f0,_c,_w,_h,opt->workspace_allocator);
    if (local_98.refcount != (int *)0x0) {
      LOCK();
      *local_98.refcount = *local_98.refcount + 1;
      UNLOCK();
    }
    if (local_118 != (int *)0x0) {
      LOCK();
      *local_118 = *local_118 + -1;
      UNLOCK();
      if (*local_118 == 0) {
        if (pAVar25 == (Allocator *)0x0) {
          if (puVar19 != (undefined4 *)0x0) {
            free(puVar19);
          }
        }
        else {
          (*pAVar25->_vptr_Allocator[3])(pAVar25,puVar19);
        }
      }
    }
    sVar15 = local_98.cstep;
    iVar27 = local_98.c;
    pAVar25 = local_98.allocator;
    sVar26 = local_98.elemsize;
    puVar19 = (undefined4 *)local_98.data;
    local_118 = local_98.refcount;
    if (local_98.refcount != (int *)0x0) {
      LOCK();
      *local_98.refcount = *local_98.refcount + -1;
      UNLOCK();
      if (*local_98.refcount == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_98.data != (undefined4 *)0x0) {
            free(local_98.data);
          }
        }
        else {
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar13 = this->ndim;
  }
  if (iVar13 == 4) {
    Mat::reshape(&local_98,&local_f0,_c,_w,_h,_d,opt->workspace_allocator);
    if (local_98.refcount != (int *)0x0) {
      LOCK();
      *local_98.refcount = *local_98.refcount + 1;
      UNLOCK();
    }
    if (local_118 != (int *)0x0) {
      LOCK();
      *local_118 = *local_118 + -1;
      UNLOCK();
      if (*local_118 == 0) {
        if (pAVar25 == (Allocator *)0x0) {
          if (puVar19 != (undefined4 *)0x0) {
            free(puVar19);
          }
        }
        else {
          (*pAVar25->_vptr_Allocator[3])(pAVar25,puVar19);
        }
      }
    }
    local_118 = local_98.refcount;
    puVar19 = (undefined4 *)local_98.data;
    sVar15 = local_98.cstep;
    pAVar25 = local_98.allocator;
    sVar26 = local_98.elemsize;
    iVar27 = local_98.c;
    if (local_98.refcount != (int *)0x0) {
      LOCK();
      *local_98.refcount = *local_98.refcount + -1;
      UNLOCK();
      if (*local_98.refcount == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_98.data != (undefined4 *)0x0) {
            free(local_98.data);
          }
        }
        else {
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  pMVar8 = local_a0;
  iVar17 = -100;
  if ((puVar19 != (undefined4 *)0x0) && ((long)iVar27 * sVar15 != 0)) {
    iVar13 = this->ndim;
    uVar18 = (ulong)_h;
    local_40 = sVar15;
    if (iVar13 == 2) {
      Mat::create(local_a0,_w,_h,(size_t)local_a8,opt->blob_allocator);
      puVar21 = (undefined4 *)pMVar8->data;
      iVar17 = -100;
      if ((puVar21 == (undefined4 *)0x0) || ((long)pMVar8->c * pMVar8->cstep == 0))
      goto LAB_0032b83e;
      if (0 < (int)_h) {
        uVar20 = 0;
        puVar23 = puVar19;
        do {
          uVar22 = (ulong)_w;
          puVar16 = puVar23;
          if (0 < (int)_w) {
            do {
              *puVar21 = *puVar16;
              puVar21 = puVar21 + 1;
              puVar16 = puVar16 + uVar18;
              uVar22 = uVar22 - 1;
            } while (uVar22 != 0);
          }
          uVar20 = uVar20 + 1;
          puVar23 = puVar23 + 1;
        } while (uVar20 != uVar18);
      }
      iVar13 = this->ndim;
    }
    pMVar8 = local_a0;
    local_50 = pAVar25;
    if (iVar13 == 3) {
      Mat::create(local_a0,_w,_h,_c,(size_t)local_a8,opt->blob_allocator);
      local_38 = pMVar8->data;
      iVar17 = -100;
      if ((local_38 == (void *)0x0) || (local_48 = pMVar8->cstep, (long)pMVar8->c * local_48 == 0))
      goto LAB_0032b83e;
      if (0 < (int)_c) {
        local_48 = local_48 * local_a0->elemsize;
        uVar20 = 0;
        puVar21 = puVar19;
        do {
          if (0 < (int)_h) {
            puVar16 = (undefined4 *)(local_48 * uVar20 + (long)local_38);
            uVar22 = 0;
            puVar23 = puVar21;
            do {
              uVar24 = (ulong)_w;
              puVar28 = puVar23;
              if (0 < (int)_w) {
                do {
                  *puVar16 = *puVar28;
                  puVar16 = puVar16 + 1;
                  puVar28 = puVar28 + _c;
                  uVar24 = uVar24 - 1;
                } while (uVar24 != 0);
              }
              uVar22 = uVar22 + 1;
              puVar23 = (undefined4 *)((long)puVar23 + sVar26 * local_40);
            } while (uVar22 != uVar18);
          }
          uVar20 = uVar20 + 1;
          puVar21 = puVar21 + 1;
        } while (uVar20 != _c);
      }
    }
    pAVar25 = local_50;
    pMVar8 = local_a0;
    if (this->ndim == 4) {
      Mat::create(local_a0,_w,_h,_d,_c,(size_t)local_a8,opt->blob_allocator);
      local_a8 = pMVar8->data;
      iVar17 = -100;
      if (((local_a8 != (void *)0x0) && (sVar15 = pMVar8->cstep, (long)pMVar8->c * sVar15 != 0)) &&
         (iVar17 = 0, 0 < (int)_c)) {
        sVar6 = pMVar8->elemsize;
        uVar18 = 0;
        do {
          if (0 < (int)_d) {
            puVar21 = (undefined4 *)(sVar15 * sVar6 * uVar18 + (long)local_a8);
            uVar20 = 0;
            do {
              if (0 < (int)_h) {
                uVar24 = uVar18 & 0xffffffff;
                uVar22 = 0;
                do {
                  iVar13 = (int)uVar24;
                  uVar14 = (ulong)_w;
                  if (0 < (int)_w) {
                    do {
                      *puVar21 = *(undefined4 *)
                                  ((long)puVar19 +
                                  (long)(int)uVar24 * 4 + sVar26 * local_40 * uVar20);
                      puVar21 = puVar21 + 1;
                      uVar24 = (ulong)((int)uVar24 + _c);
                      uVar14 = uVar14 - 1;
                    } while (uVar14 != 0);
                  }
                  uVar22 = uVar22 + 1;
                  uVar24 = (ulong)(iVar13 + _w * _c);
                } while (uVar22 != _h);
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 != _d);
          }
          uVar18 = uVar18 + 1;
          iVar17 = 0;
          pAVar25 = local_50;
        } while (uVar18 != _c);
      }
    }
    else {
      iVar17 = 0;
    }
  }
LAB_0032b83e:
  if (local_118 != (int *)0x0) {
    LOCK();
    *local_118 = *local_118 + -1;
    UNLOCK();
    if (*local_118 == 0) {
      if (pAVar25 == (Allocator *)0x0) {
        if (puVar19 != (undefined4 *)0x0) {
          free(puVar19);
        }
      }
      else {
        (*pAVar25->_vptr_Allocator[3])(pAVar25,puVar19);
      }
    }
  }
LAB_0032b956:
  if (local_f0.refcount != (int *)0x0) {
    LOCK();
    *local_f0.refcount = *local_f0.refcount + -1;
    UNLOCK();
    if (*local_f0.refcount == 0) {
      if (local_f0.allocator == (Allocator *)0x0) {
        if ((undefined4 *)local_f0.data != (undefined4 *)0x0) {
          free(local_f0.data);
        }
      }
      else {
        (*(local_f0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar17;
}

Assistant:

int Reshape::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    size_t elemsize = bottom_blob.elemsize;
    int total = bottom_blob.w * bottom_blob.h * bottom_blob.d * bottom_blob.c;

    int dims = bottom_blob.dims;

    // resolve out shape

    int outw = w;
    int outh = h;
    int outd = d;
    int outc = c;

    if (ndim == 1)
    {
        if (outw == 0)
            outw = bottom_blob.w;

        if (outw == -1)
            outw = total;

        if (dims == 1 && bottom_blob.w == outw)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }
    if (ndim == 2)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;

        if (outw == -1)
            outw = total / outh;
        if (outh == -1)
            outh = total / outw;

        if (dims == 2 && bottom_blob.h == outh)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }
    if (ndim == 3)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;
        if (outc == 0)
            outc = bottom_blob.c;

        if (outw == -1)
            outw = total / outc / outh;
        if (outh == -1)
            outh = total / outc / outw;
        if (outc == -1)
            outc = total / outh / outw;

        if (dims == 3 && bottom_blob.c == outc)
        {
            top_blob = bottom_blob;
            top_blob.w = outw;
            top_blob.h = outh;
            return 0;
        }
    }
    if (ndim == 4)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;
        if (outc == 0)
            outc = bottom_blob.c;
        if (outd == 0)
            outd = bottom_blob.d;

        if (outw == -1)
            outw = total / outc / outd / outh;
        if (outh == -1)
            outh = total / outc / outd / outw;
        if (outd == -1)
            outd = total / outc / outh / outw;
        if (outc == -1)
            outc = total / outd / outh / outw;

        if (dims == 4 && bottom_blob.c == outc)
        {
            top_blob = bottom_blob;
            top_blob.w = outw;
            top_blob.h = outh;
            top_blob.d = outd;
            return 0;
        }
    }

    bool need_permute = permute == 1;
    if (dims == 2 && ndim == 2 && bottom_blob.h == outh)
        need_permute = false;
    if (dims == 3 && ndim == 3 && bottom_blob.c == outc)
        need_permute = false;
    if (dims == 4 && ndim == 4 && bottom_blob.c == outc)
        need_permute = false;

    if (need_permute)
    {
        Mat bottom_blob_permuted = bottom_blob;

        if (dims == 2)
        {
            // hw -> wh
            int _w = bottom_blob.w;
            int _h = bottom_blob.h;

            bottom_blob_permuted.create(_h, _w, elemsize, opt.workspace_allocator);
            if (bottom_blob_permuted.empty())
                return -100;

            const float* ptr = bottom_blob;
            float* outptr = bottom_blob_permuted;

            for (int i = 0; i < _w; i++)
            {
                for (int j = 0; j < _h; j++)
                {
                    *outptr++ = ptr[j * _w + i];
                }
            }
        }
        if (dims == 3)
        {
            // chw -> hwc
            int _w = bottom_blob.w;
            int _h = bottom_blob.h;
            int channels = bottom_blob.c;

            bottom_blob_permuted.create(channels, _w, _h, elemsize, opt.workspace_allocator);
            if (bottom_blob_permuted.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < _h; q++)
            {
                float* outptr = bottom_blob_permuted.channel(q);

                for (int i = 0; i < _w; i++)
                {
                    for (int j = 0; j < channels; j++)
                    {
                        *outptr++ = bottom_blob.channel(j).row(q)[i];
                    }
                }
            }
        }

        if (dims == 4)
        {
            // cdhw -> dhwc
            int _w = bottom_blob.w;
            int _h = bottom_blob.h;
            int _d = bottom_blob.d;
            int channels = bottom_blob.c;

            bottom_blob_permuted.create(channels, _w, _h, _d, elemsize, opt.workspace_allocator);
            if (bottom_blob_permuted.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int z = 0; z < _d; z++)
            {
                float* outptr = bottom_blob_permuted.channel(z);

                for (int q = 0; q < _h; q++)
                {
                    for (int i = 0; i < _w; i++)
                    {
                        for (int j = 0; j < channels; j++)
                        {
                            *outptr++ = bottom_blob.channel(j).depth(z).row(q)[i];
                        }
                    }
                }
            }
        }

        if (ndim == 1)
        {
            top_blob = bottom_blob_permuted.reshape(outw, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        // permute on ndhwc/nhwc/nhc
        Mat top_blob_permuted;
        if (ndim == 2)
        {
            top_blob_permuted = bottom_blob_permuted.reshape(outh, outw, opt.workspace_allocator);
        }
        if (ndim == 3)
        {
            top_blob_permuted = bottom_blob_permuted.reshape(outc, outw, outh, opt.workspace_allocator);
        }
        if (ndim == 4)
        {
            top_blob_permuted = bottom_blob_permuted.reshape(outc, outw, outh, outd, opt.workspace_allocator);
        }
        if (top_blob_permuted.empty())
            return -100;

        if (ndim == 2)
        {
            // wh -> hw
            top_blob.create(outw, outh, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = top_blob_permuted;
            float* outptr = top_blob;

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    *outptr++ = ptr[j * outh + i];
                }
            }
        }
        if (ndim == 3)
        {
            // hwc -> chw
            top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    const float* ptr = top_blob_permuted.channel(i);

                    for (int j = 0; j < outw; j++)
                    {
                        *outptr++ = ptr[j * outc + q];
                    }
                }
            }
        }
        if (ndim == 4)
        {
            // dhwc -> cdhw
            top_blob.create(outw, outh, outd, outc, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int k = 0; k < outd; k++)
                {
                    const float* ptr = top_blob_permuted.channel(k);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            *outptr++ = ptr[i * outw * outc + j * outc + q];
                        }
                    }
                }
            }
        }

        return 0;
    }

    if (ndim == 1)
    {
        top_blob = bottom_blob.reshape(outw, opt.blob_allocator);
    }
    if (ndim == 2)
    {
        top_blob = bottom_blob.reshape(outw, outh, opt.blob_allocator);
    }
    if (ndim == 3)
    {
        top_blob = bottom_blob.reshape(outw, outh, outc, opt.blob_allocator);
    }
    if (ndim == 4)
    {
        top_blob = bottom_blob.reshape(outw, outh, outd, outc, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    return 0;
}